

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O2

aom_codec_err_t av1_firstpass_info_push(FIRSTPASS_INFO *firstpass_info,FIRSTPASS_STATS *input_stats)

{
  if (firstpass_info->stats_count < firstpass_info->stats_buf_size) {
    memcpy(firstpass_info->stats_buf +
           (firstpass_info->stats_count + firstpass_info->start_index) %
           firstpass_info->stats_buf_size,input_stats,0xe8);
    firstpass_info->stats_count = firstpass_info->stats_count + 1;
    firstpass_info->future_stats_count = firstpass_info->future_stats_count + 1;
    av1_accumulate_stats(&firstpass_info->total_stats,input_stats);
    return AOM_CODEC_OK;
  }
  return AOM_CODEC_ERROR;
}

Assistant:

aom_codec_err_t av1_firstpass_info_push(FIRSTPASS_INFO *firstpass_info,
                                        const FIRSTPASS_STATS *input_stats) {
  if (firstpass_info->stats_count < firstpass_info->stats_buf_size) {
    const int next_index =
        (firstpass_info->start_index + firstpass_info->stats_count) %
        firstpass_info->stats_buf_size;
    firstpass_info->stats_buf[next_index] = *input_stats;
    ++firstpass_info->stats_count;
    ++firstpass_info->future_stats_count;
    av1_accumulate_stats(&firstpass_info->total_stats, input_stats);
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_ERROR;
  }
}